

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeTransferError(Vdbe *p)

{
  u8 uVar1;
  int err_code;
  sqlite3 *db;
  sqlite3_value *v;
  _func_void_void_ptr *in_R8;
  
  db = p->db;
  err_code = p->rc;
  if (p->zErrMsg == (char *)0x0) {
    sqlite3Error(db,err_code);
  }
  else {
    uVar1 = db->mallocFailed;
    if (sqlite3Hooks_0 != (code *)0x0) {
      (*sqlite3Hooks_0)();
    }
    v = db->pErr;
    if (v == (sqlite3_value *)0x0) {
      v = sqlite3ValueNew(db);
      db->pErr = v;
    }
    sqlite3ValueSetStr(v,(int)p->zErrMsg,(void *)0x1,0xff,in_R8);
    if (sqlite3Hooks_1 != (code *)0x0) {
      (*sqlite3Hooks_1)();
    }
    db->mallocFailed = uVar1;
    db->errCode = err_code;
  }
  return err_code;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeTransferError(Vdbe *p){
  sqlite3 *db = p->db;
  int rc = p->rc;
  if( p->zErrMsg ){
    u8 mallocFailed = db->mallocFailed;
    sqlite3BeginBenignMalloc();
    if( db->pErr==0 ) db->pErr = sqlite3ValueNew(db);
    sqlite3ValueSetStr(db->pErr, -1, p->zErrMsg, SQLITE_UTF8, SQLITE_TRANSIENT);
    sqlite3EndBenignMalloc();
    db->mallocFailed = mallocFailed;
    db->errCode = rc;
  }else{
    sqlite3Error(db, rc);
  }
  return rc;
}